

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O2

string * absl::lts_20240722::flags_internal::(anonymous_namespace)::NormalizeFilename_abi_cxx11_
                   (string_view filename)

{
  size_type sVar1;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = in_RSI;
  local_18._M_str = in_RDX;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (&local_18,"\\/",0);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_19);
  }
  else {
    local_18._M_str = local_18._M_str + sVar1;
    local_18._M_len = local_18._M_len - sVar1;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)in_RDI,&local_18,&local_19);
  }
  return in_RDI;
}

Assistant:

std::string NormalizeFilename(absl::string_view filename) {
  // Skip any leading slashes
  auto pos = filename.find_first_not_of("\\/");
  if (pos == absl::string_view::npos) return "";

  filename.remove_prefix(pos);
  return std::string(filename);
}